

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

Scal __thiscall LinearExpert::queryHafterZ(LinearExpert *this,X *x)

{
  X *this_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  Index index;
  ulong uVar9;
  long lVar10;
  ActualDstType actualDst;
  double dVar11;
  Scalar SVar12;
  Scal SVar13;
  scalar_sum_op<double,_double> local_79;
  double local_78;
  Scal local_70;
  undefined1 local_68 [32];
  undefined1 local_48 [24];
  X *local_30;
  
  this_00 = &this->dx;
  pdVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar5 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  lVar10 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((this->dx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      lVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar10,1);
  }
  pdVar6 = (this->dx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar7 = (this->dx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  uVar9 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar7) {
    lVar10 = 0;
    do {
      pdVar1 = pdVar4 + lVar10;
      dVar11 = pdVar1[1];
      pdVar2 = pdVar5 + lVar10;
      dVar8 = pdVar2[1];
      pdVar3 = pdVar6 + lVar10;
      *pdVar3 = *pdVar1 - *pdVar2;
      pdVar3[1] = dVar11 - dVar8;
      lVar10 = lVar10 + 2;
    } while (lVar10 < (long)uVar9);
  }
  if ((long)uVar9 < (long)uVar7) {
    do {
      pdVar6[uVar9] = pdVar4[uVar9] - pdVar5[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  local_68._0_8_ = &this->dz;
  local_68._8_8_ = &this->invSigma;
  dVar11 = -0.0;
  local_68._16_8_ = local_68._0_8_;
  if ((this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows != 0) {
    local_48._8_8_ =
         (((Z *)local_68._0_8_)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
         m_storage.m_data;
    Eigen::internal::
    product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                         *)(local_48 + 0x10),(XprType *)(local_68 + 8));
    local_78 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>>,3,0>
               ::
               run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                         ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                           *)local_48,&local_79,
                          (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                           *)local_68);
    free(local_30);
    dVar11 = local_78 * -0.5;
  }
  local_78 = exp(dVar11);
  local_30 = &this->invPsi;
  dVar11 = -0.0;
  SVar13 = this->sqrtDetInvSigma;
  local_48._8_8_ = this_00;
  if ((this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 0) {
    local_68._16_8_ =
         (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_68._24_8_ =
         (local_30->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    local_70 = this->sqrtDetInvSigma;
    SVar12 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_68,&local_79,
                        (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)local_48);
    dVar11 = SVar12 * -0.5;
    SVar13 = local_70;
  }
  local_78 = local_78 * SVar13;
  dVar11 = exp(dVar11);
  dVar11 = dVar11 * local_78 * this->sqrtDetInvPsi;
  this->h = dVar11;
  return dVar11;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryHafterZ( X const &x )
{
    dx = x - pred_x;

    h = exp(-0.5*dz.dot(invSigma * dz)) * sqrtDetInvSigma * exp(-0.5*dx.cwiseAbs2().dot(invPsi)) * sqrtDetInvPsi;

    return h;
}